

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_make_standard_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  sexp env;
  sexp_gc_var_t local_20;
  
  local_20.var = &env;
  env = (sexp)&DAT_0000043e;
  local_20.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_20;
  env = sexp_make_primitive_env_op(ctx,self,(sexp_sint_t)local_20.next,version);
  if ((((ulong)env & 3) != 0) || (env->tag != 0x13)) {
    env = sexp_load_standard_env(ctx,env,(sexp)&DAT_0000000f);
  }
  if ((((ulong)env & 3) == 0) && (env->tag == 0x17)) {
    env->field_0x5 = env->field_0x5 | 1;
  }
  (ctx->value).context.saves = local_20.next;
  return env;
}

Assistant:

sexp sexp_make_standard_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  sexp_gc_var1(env);
  sexp_gc_preserve1(ctx, env);
  env = sexp_make_primitive_env(ctx, version);
  if (! sexp_exceptionp(env)) env = sexp_load_standard_env(ctx, env, SEXP_SEVEN);
  if (sexp_envp(env)) sexp_immutablep(env) = 1;
  sexp_gc_release1(ctx);
  return env;
}